

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector2.h
# Opt level: O2

ostream * RVO::operator<<(ostream *os,Vector2 *vector)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"(");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,vector->x_);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,vector->y_);
  std::operator<<(poVar1,")");
  return os;
}

Assistant:

inline std::ostream &operator<<(std::ostream &os, const Vector2 &vector)
	{
		os << "(" << vector.x() << "," << vector.y() << ")";

		return os;
	}